

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Observer.cpp
# Opt level: O2

void longf(float f)

{
  long lVar1;
  ostream *poVar2;
  
  spin_mutex_t::lock(&my_io_mutex);
  std::operator<<((ostream *)&std::cerr,"longf begin: ");
  lVar1 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar1 - (long)t0.__d.__r) / 1000000000.0);
  poVar2 = std::operator<<(poVar2," with f=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f);
  poVar2 = std::operator<<(poVar2," x=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,x);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  x = x << 1;
  mywait(f);
  x = x << 1;
  spin_mutex_t::lock(&my_io_mutex);
  std::operator<<((ostream *)&std::cerr,"longf end: ");
  lVar1 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar1 - (long)t0.__d.__r) / 1000000000.0);
  poVar2 = std::operator<<(poVar2," with f=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f);
  poVar2 = std::operator<<(poVar2," x=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,x);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  return;
}

Assistant:

void longf(float f) {
  LOG("longf begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with f=" << f << " x=" << x);
  
  x = x * 2;
  
  mywait(f);
  
  x = x * 2;
  
  LOG("longf end: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with f=" << f << " x=" << x);
}